

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O2

void ImGui_ImplGlfwGL3_RenderDrawData(ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  ImDrawList *this;
  GLboolean GVar3;
  GLboolean GVar4;
  GLboolean GVar5;
  GLboolean GVar6;
  int iVar7;
  ImGuiIO *pIVar8;
  value_type *pvVar9;
  PFNGLENABLEPROC *pp_Var10;
  long lVar11;
  PFNGLENABLEPROC *pp_Var12;
  void *pvVar13;
  int cmd_i;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  GLuint vao_handle;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array;
  GLint last_element_array_buffer;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  float local_78 [6];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  pIVar8 = ImGui::GetIO();
  iVar15 = (int)((pIVar8->DisplayFramebufferScale).x * (pIVar8->DisplaySize).x);
  iVar16 = (int)((pIVar8->DisplayFramebufferScale).y * (pIVar8->DisplaySize).y);
  auVar14._0_4_ = -(uint)(iVar15 == 0);
  auVar14._4_4_ = -(uint)(iVar15 == 0);
  auVar14._8_4_ = -(uint)(iVar16 == 0);
  auVar14._12_4_ = -(uint)(iVar16 == 0);
  iVar7 = movmskpd((int)pIVar8,auVar14);
  if (iVar7 == 0) {
    ImDrawData::ScaleClipRects(draw_data,&pIVar8->DisplayFramebufferScale);
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&last_active_texture);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,&last_program);
    (*glad_glGetIntegerv)(0x8069,&last_texture);
    (*glad_glGetIntegerv)(0x8919,&last_sampler);
    (*glad_glGetIntegerv)(0x8894,&last_array_buffer);
    (*glad_glGetIntegerv)(0x8895,&last_element_array_buffer);
    (*glad_glGetIntegerv)(0x85b5,&last_vertex_array);
    (*glad_glGetIntegerv)(0xb40,last_polygon_mode);
    (*glad_glGetIntegerv)(0xba2,last_viewport);
    (*glad_glGetIntegerv)(0xc10,last_scissor_box);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&last_blend_src_rgb);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&last_blend_dst_rgb);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&last_blend_src_alpha);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&last_blend_dst_alpha);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&last_blend_equation_rgb);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&last_blend_equation_alpha);
    GVar3 = (*glad_glIsEnabled)(0xbe2);
    GVar4 = (*glad_glIsEnabled)(0xb44);
    GVar5 = (*glad_glIsEnabled)(0xb71);
    GVar6 = (*glad_glIsEnabled)(0xc11);
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendEquation)(0x8006);
    (*glad_glBlendFunc)(0x302,0x303);
    (*glad_glDisable)(0xb44);
    (*glad_glDisable)(0xb71);
    (*glad_glEnable)(0xc11);
    (*glad_glPolygonMode)(0x408,0x1b02);
    (*glad_glViewport)(0,0,iVar15,iVar16);
    local_78[0] = 2.0 / (pIVar8->DisplaySize).x;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    local_78[4] = 0.0;
    local_78[5] = -2.0 / (pIVar8->DisplaySize).y;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0xbf800000;
    uStack_48 = 0x3f800000bf800000;
    local_40 = 0x3f80000000000000;
    (*glad_glUseProgram)(g_ShaderHandle);
    (*glad_glUniform1i)(g_AttribLocationTex,0);
    (*glad_glUniformMatrix4fv)(g_AttribLocationProjMtx,1,'\0',local_78);
    if (glad_glBindSampler != (PFNGLBINDSAMPLERPROC)0x0) {
      (*glad_glBindSampler)(0,0);
    }
    vao_handle = 0;
    (*glad_glGenVertexArrays)(1,&vao_handle);
    (*glad_glBindVertexArray)(vao_handle);
    (*glad_glBindBuffer)(0x8892,g_VboHandle);
    (*glad_glEnableVertexAttribArray)(g_AttribLocationPosition);
    (*glad_glEnableVertexAttribArray)(g_AttribLocationUV);
    (*glad_glEnableVertexAttribArray)(g_AttribLocationColor);
    (*glad_glVertexAttribPointer)(g_AttribLocationPosition,2,0x1406,'\0',0x14,(void *)0x0);
    (*glad_glVertexAttribPointer)(g_AttribLocationUV,2,0x1406,'\0',0x14,(void *)0x8);
    (*glad_glVertexAttribPointer)(g_AttribLocationColor,4,0x1401,'\x01',0x14,(void *)0x10);
    lVar11 = 0;
    while( true ) {
      if (draw_data->CmdListsCount <= lVar11) break;
      this = draw_data->CmdLists[lVar11];
      (*glad_glBindBuffer)(0x8892,g_VboHandle);
      (*glad_glBufferData)(0x8892,(long)(this->VtxBuffer).Size * 0x14,(this->VtxBuffer).Data,0x88e0)
      ;
      (*glad_glBindBuffer)(0x8893,g_ElementsHandle);
      (*glad_glBufferData)(0x8893,(long)(this->IdxBuffer).Size * 2,(this->IdxBuffer).Data,0x88e0);
      pvVar13 = (void *)0x0;
      for (iVar7 = 0; iVar7 < (this->CmdBuffer).Size; iVar7 = iVar7 + 1) {
        pvVar9 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar7);
        if (pvVar9->UserCallback == (ImDrawCallback)0x0) {
          (*glad_glBindTexture)(0xde1,*(GLuint *)&pvVar9->TextureId);
          fVar1 = (pvVar9->ClipRect).x;
          fVar2 = (pvVar9->ClipRect).w;
          (*glad_glScissor)((int)fVar1,(int)((float)iVar16 - fVar2),
                            (int)((pvVar9->ClipRect).z - fVar1),(int)(fVar2 - (pvVar9->ClipRect).y))
          ;
          (*glad_glDrawElements)(4,pvVar9->ElemCount,0x1403,pvVar13);
        }
        else {
          (*pvVar9->UserCallback)(this,pvVar9);
        }
        pvVar13 = (void *)((long)pvVar13 + (ulong)pvVar9->ElemCount * 2);
      }
      lVar11 = lVar11 + 1;
    }
    (*glad_glDeleteVertexArrays)(1,&vao_handle);
    (*glad_glUseProgram)(last_program);
    (*glad_glBindTexture)(0xde1,last_texture);
    if (glad_glBindSampler != (PFNGLBINDSAMPLERPROC)0x0) {
      (*glad_glBindSampler)(0,last_sampler);
    }
    (*glad_glActiveTexture)(last_active_texture);
    (*glad_glBindVertexArray)(last_vertex_array);
    (*glad_glBindBuffer)(0x8892,last_array_buffer);
    (*glad_glBindBuffer)(0x8893,last_element_array_buffer);
    (*glad_glBlendEquationSeparate)(last_blend_equation_rgb,last_blend_equation_alpha);
    (*glad_glBlendFuncSeparate)
              (last_blend_src_rgb,last_blend_dst_rgb,last_blend_src_alpha,last_blend_dst_alpha);
    pp_Var12 = &glad_glEnable;
    pp_Var10 = &glad_glEnable;
    if (GVar3 == '\0') {
      pp_Var10 = &glad_glDisable;
    }
    (**pp_Var10)(0xbe2);
    pp_Var10 = &glad_glEnable;
    if (GVar4 == '\0') {
      pp_Var10 = &glad_glDisable;
    }
    (**pp_Var10)(0xb44);
    pp_Var10 = &glad_glEnable;
    if (GVar5 == '\0') {
      pp_Var10 = &glad_glDisable;
    }
    (**pp_Var10)(0xb71);
    if (GVar6 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xc11);
    (*glad_glPolygonMode)(0x408,last_polygon_mode[0]);
    (*glad_glViewport)(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    (*glad_glScissor)(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],
                      last_scissor_box[3]);
  }
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    ImGuiIO& io = ImGui::GetIO();
    int fb_width = (int)(io.DisplaySize.x * io.DisplayFramebufferScale.x);
    int fb_height = (int)(io.DisplaySize.y * io.DisplayFramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;
    draw_data->ScaleClipRects(io.DisplayFramebufferScale);

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    GLint last_element_array_buffer; glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &last_element_array_buffer);
    GLint last_vertex_array; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);

    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);

    // Setup viewport, orthographic projection matrix
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    const float ortho_projection[4][4] =
    {
        { 2.0f/io.DisplaySize.x, 0.0f,                   0.0f, 0.0f },
        { 0.0f,                  2.0f/-io.DisplaySize.y, 0.0f, 0.0f },
        { 0.0f,                  0.0f,                  -1.0f, 0.0f },
        {-1.0f,                  1.0f,                   0.0f, 1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);
    if (glBindSampler) glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.

    // Recreate the VAO every time 
    // (This is to easily allow multiple GL contexts. VAO are not shared among GL contexts, and we don't track creation/deletion of windows so we don't have an obvious key to use to cache them.)
    GLuint vao_handle = 0;
    glGenVertexArrays(1, &vao_handle);
    glBindVertexArray(vao_handle);
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glEnableVertexAttribArray(g_AttribLocationPosition);
    glEnableVertexAttribArray(g_AttribLocationUV);
    glEnableVertexAttribArray(g_AttribLocationColor);
    glVertexAttribPointer(g_AttribLocationPosition, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationUV, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationColor, 4, GL_UNSIGNED_BYTE, GL_TRUE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));

    // Draw
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawIdx* idx_buffer_offset = 0;

        glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);

        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                glScissor((int)pcmd->ClipRect.x, (int)(fb_height - pcmd->ClipRect.w), (int)(pcmd->ClipRect.z - pcmd->ClipRect.x), (int)(pcmd->ClipRect.w - pcmd->ClipRect.y));
                glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);
            }
            idx_buffer_offset += pcmd->ElemCount;
        }
    }
    glDeleteVertexArrays(1, &vao_handle);

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
    if (glBindSampler) glBindSampler(0, last_sampler);
    glActiveTexture(last_active_texture);
    glBindVertexArray(last_vertex_array);
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, last_element_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}